

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void storeRGBX32FFromRGBA32F_sse4
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar5 [16];
  float fVar9;
  float fVar11;
  float fVar12;
  undefined1 auVar10 [16];
  float fVar13;
  
  auVar1 = _DAT_005de980;
  uVar3 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    auVar10 = *(undefined1 (*) [16])((long)&src->r + uVar3);
    fVar4 = auVar10._0_4_;
    fVar6 = auVar10._4_4_;
    fVar7 = auVar10._8_4_;
    fVar8 = auVar10._12_4_;
    if (((fVar8 != 1.0) || (NAN(fVar8))) && ((fVar8 != 0.0 || (auVar10 = auVar1, NAN(fVar8))))) {
      auVar10._4_4_ = fVar8;
      auVar10._0_4_ = fVar8;
      auVar10._8_4_ = fVar8;
      auVar10._12_4_ = fVar8;
      auVar10 = rcpps(auVar1,auVar10);
      fVar9 = auVar10._0_4_;
      fVar11 = auVar10._4_4_;
      fVar12 = auVar10._8_4_;
      fVar13 = auVar10._12_4_;
      auVar5._0_4_ = fVar4 * ((fVar9 + fVar9) - fVar8 * fVar9 * fVar9);
      auVar5._4_4_ = fVar6 * ((fVar11 + fVar11) - fVar8 * fVar11 * fVar11);
      auVar5._8_4_ = fVar7 * ((fVar12 + fVar12) - fVar8 * fVar12 * fVar12);
      auVar5._12_4_ = fVar8 * ((fVar13 + fVar13) - fVar8 * fVar13 * fVar13);
      auVar10 = insertps(auVar5,0x3f800000,0x30);
    }
    *(undefined1 (*) [16])(dest + uVar3 + (long)index * 0x10) = auVar10;
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBX32FFromRGBA32F_sse4(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgbaFloat32 *d = reinterpret_cast<QRgbaFloat32 *>(dest) + index;
    const __m128 zero = _mm_set_ps(1.0f, 0.0f, 0.0f, 0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_load_ps(reinterpret_cast<const float *>(src + i));
        const __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsf = _mm_mul_ps(vsf, vsr);
            vsf = _mm_insert_ps(vsf, _mm_set_ss(1.0f), 0x30);
        }
        _mm_store_ps(reinterpret_cast<float *>(d + i), vsf);
    }
}